

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

VkDescriptorSetLayout * __thiscall
vkt::pipeline::multisample::MSInstanceSampleMaskPattern::createMSPassDescSetLayout
          (MSInstanceSampleMaskPattern *this,ImageMSParams *imageMSParams)

{
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  DescriptorSetLayoutBuilder *this_00;
  Handle<(vk::HandleType)19> *pHVar1;
  DescriptorSetLayoutBuilder local_b0;
  Move<vk::Handle<(vk::HandleType)19>_> local_68;
  RefData<vk::Handle<(vk::HandleType)19>_> local_48;
  VkDevice local_28;
  VkDevice device;
  DeviceInterface *deviceInterface;
  ImageMSParams *imageMSParams_local;
  MSInstanceSampleMaskPattern *this_local;
  
  deviceInterface = (DeviceInterface *)imageMSParams;
  imageMSParams_local = (ImageMSParams *)this;
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                      super_MultisampleInstanceBase.super_TestInstance.m_context);
  local_28 = Context::getDevice((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                                super_MultisampleInstanceBase.super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_b0);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_b0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x10);
  ::vk::DescriptorSetLayoutBuilder::build(&local_68,this_00,(DeviceInterface *)device,local_28,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_48,(Move *)&local_68);
  data.deleter.m_deviceIface = local_48.deleter.m_deviceIface;
  data.object.m_internal = local_48.object.m_internal;
  data.deleter.m_device = local_48.deleter.m_device;
  data.deleter.m_allocator = local_48.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (&this->m_descriptorSetLayout,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_68);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_b0);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                     (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>)
  ;
  return pHVar1;
}

Assistant:

const VkDescriptorSetLayout* MSInstanceSampleMaskPattern::createMSPassDescSetLayout (const ImageMSParams& imageMSParams)
{
	DE_UNREF(imageMSParams);

	const DeviceInterface&		deviceInterface = m_context.getDeviceInterface();
	const VkDevice				device			= m_context.getDevice();

	// Create descriptor set layout
	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_FRAGMENT_BIT)
		.build(deviceInterface, device);

	return &m_descriptorSetLayout.get();
}